

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O2

int uts_numChildren_bin(Node *parent)

{
  int iVar1;
  double dVar2;
  
  iVar1 = rng_rand((parent->state).state);
  dVar2 = rng_toProb(iVar1);
  iVar1 = 0;
  if (dVar2 < nonLeafProb) {
    iVar1 = nonLeafBF;
  }
  return iVar1;
}

Assistant:

int uts_numChildren_bin(Node * parent) {
  // distribution is identical everywhere below root
  int    v = rng_rand(parent->state.state);	
  double d = rng_toProb(v);

  return (d < nonLeafProb) ? nonLeafBF : 0;
}